

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_server.cc
# Opt level: O2

size_t __thiscall xLearn::KVStore::GetServerId(KVStore *this,index_t feat_id)

{
  return (ulong)feat_id % this->server_num_;
}

Assistant:

size_t KVStore::GetServerId(const index_t feat_id) const {
  CHECK_GE(feat_id, 0);
  return feat_id % server_num_;
}